

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_2000_2999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case2016(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator<char> local_524;
  allocator<char> local_523;
  allocator<char> local_522;
  allocator<char> local_521;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0 [32];
  Expectation local_4a0;
  Expectation local_3e8;
  Decl local_330;
  Decl local_268;
  Decl local_1a0;
  Decl local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_4c0,"\nstruct\n{\n    struct { int y ; } z ;\n};\n         ",&local_521);
  Expectation::Expectation(&local_4a0);
  Decl::Decl(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"z",&local_522);
  pDVar1 = Decl::Member(&local_1a0,&local_4e0,FieldDeclaration);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"",&local_523);
  __len = 6;
  pDVar1 = Ty::Tag(&pDVar1->ty_,&local_500,Struct,None);
  Decl::Decl(&local_d8,pDVar1);
  pEVar2 = Expectation::declaration(&local_4a0,&local_d8);
  Decl::Decl(&local_330);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_520,"y",&local_524);
  pDVar1 = Decl::Member(&local_330,&local_520,FieldDeclaration);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_268,pDVar1);
  pEVar2 = Expectation::declaration(pEVar2,&local_268);
  Expectation::Expectation(&local_3e8,pEVar2);
  bind(this,(int)local_4c0,(sockaddr *)&local_3e8,__len);
  Expectation::~Expectation(&local_3e8);
  Decl::~Decl(&local_268);
  std::__cxx11::string::~string((string *)&local_520);
  Decl::~Decl(&local_330);
  Decl::~Decl(&local_d8);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_4e0);
  Decl::~Decl(&local_1a0);
  Expectation::~Expectation(&local_4a0);
  std::__cxx11::string::~string(local_4c0);
  return;
}

Assistant:

void DeclarationBinderTester::case2016()
{
    bind(R"(
struct
{
    struct { int y ; } z ;
};
         )",
         Expectation()
            .declaration(
                Decl().Member("z", SymbolKind::FieldDeclaration).ty_.Tag("", TagTypeKind::Struct))
            .declaration(
                Decl().Member("y", SymbolKind::FieldDeclaration).ty_.Basic(BasicTypeKind::Int_S))
         );
}